

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.h
# Opt level: O3

RepeatedPtrField<google::protobuf::Message> * __thiscall
google::protobuf::Reflection::
GetRawSplit<google::protobuf::RepeatedPtrField<google::protobuf::Message>>
          (Reflection *this,Message *message,FieldDescriptor *field)

{
  ReflectionSchema *this_00;
  long lVar1;
  char *pcVar2;
  bool bVar3;
  uint32_t uVar4;
  RepeatedPtrField<google::protobuf::Message> *pRVar5;
  string_view str;
  string_view v;
  LogMessage LStack_38;
  
  VerifyFieldType<google::protobuf::RepeatedPtrField<google::protobuf::Message>>(this,field);
  this_00 = &this->schema_;
  bVar3 = internal::ReflectionSchema::InRealOneof(this_00,field);
  if (bVar3) {
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&LStack_38,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/message.h"
               ,0x6eb,"!schema_.InRealOneof(field)");
    str._M_str = "Field = ";
    str._M_len = 8;
    absl::lts_20250127::log_internal::LogMessage::
    CopyToEncodedBuffer<(absl::lts_20250127::log_internal::LogMessage::StringType)0>(&LStack_38,str)
    ;
    pcVar2 = (field->all_names_).payload_;
    v._M_len = (ulong)*(ushort *)(pcVar2 + 2);
    v._M_str = pcVar2 + ~v._M_len;
    absl::lts_20250127::log_internal::LogMessage::operator<<(&LStack_38,v);
  }
  else {
    if ((this->schema_).split_offset_ != -1) {
      uVar4 = internal::ReflectionSchema::SplitOffset(this_00);
      lVar1 = *(long *)((long)&(message->super_MessageLite)._vptr_MessageLite + (ulong)uVar4);
      uVar4 = internal::ReflectionSchema::GetFieldOffsetNonOneof(this_00,field);
      bVar3 = internal::
              SplitFieldHasExtraIndirectionStatic<google::protobuf::RepeatedPtrField<google::protobuf::Message>>
                        (field);
      pRVar5 = (RepeatedPtrField<google::protobuf::Message> *)((ulong)uVar4 + lVar1);
      if (bVar3) {
        pRVar5 = (RepeatedPtrField<google::protobuf::Message> *)
                 (pRVar5->super_RepeatedPtrFieldBase).tagged_rep_or_elem_;
      }
      return pRVar5;
    }
    GetRawSplit<google::protobuf::RepeatedPtrField<google::protobuf::Message>>();
  }
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&LStack_38)
  ;
}

Assistant:

const Type& Reflection::GetRawSplit(const Message& message,
                                    const FieldDescriptor* field) const {
  VerifyFieldType<Type>(field);
  ABSL_DCHECK(!schema_.InRealOneof(field)) << "Field = " << field->full_name();

  const void* split = GetSplitField(&message);
  const uint32_t field_offset = schema_.GetFieldOffsetNonOneof(field);
  if (internal::SplitFieldHasExtraIndirectionStatic<Type>(field)) {
    return **internal::GetConstPointerAtOffset<Type*>(split, field_offset);
  }
  return *internal::GetConstPointerAtOffset<Type>(split, field_offset);
}